

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirinfo.c
# Opt level: O0

int TIFFFieldSetGetSize(TIFFField *fip)

{
  TIFFField *fip_local;
  
  if (fip == (TIFFField *)0x0) {
    fip_local._4_4_ = 0;
  }
  else {
    switch(fip->set_field_type) {
    case TIFF_SETGET_UNDEFINED:
    case TIFF_SETGET_ASCII:
    case TIFF_SETGET_C0_ASCII:
    case TIFF_SETGET_C16_ASCII:
    case TIFF_SETGET_C32_ASCII:
    case TIFF_SETGET_OTHER:
      fip_local._4_4_ = 1;
      break;
    case TIFF_SETGET_UINT8:
    case TIFF_SETGET_SINT8:
    case TIFF_SETGET_C0_UINT8:
    case TIFF_SETGET_C0_SINT8:
    case TIFF_SETGET_C16_UINT8:
    case TIFF_SETGET_C16_SINT8:
    case TIFF_SETGET_C32_UINT8:
    case TIFF_SETGET_C32_SINT8:
      fip_local._4_4_ = 1;
      break;
    case TIFF_SETGET_UINT16:
    case TIFF_SETGET_SINT16:
    case TIFF_SETGET_C0_UINT16:
    case TIFF_SETGET_C0_SINT16:
    case TIFF_SETGET_C16_UINT16:
    case TIFF_SETGET_C16_SINT16:
    case TIFF_SETGET_C32_UINT16:
    case TIFF_SETGET_C32_SINT16:
      fip_local._4_4_ = 2;
      break;
    case TIFF_SETGET_UINT32:
    case TIFF_SETGET_SINT32:
    case TIFF_SETGET_FLOAT:
    case TIFF_SETGET_INT:
    case TIFF_SETGET_UINT16_PAIR:
    case TIFF_SETGET_C0_UINT32:
    case TIFF_SETGET_C0_SINT32:
    case TIFF_SETGET_C0_FLOAT:
    case TIFF_SETGET_C16_UINT32:
    case TIFF_SETGET_C16_SINT32:
    case TIFF_SETGET_C16_FLOAT:
    case TIFF_SETGET_C32_UINT32:
    case TIFF_SETGET_C32_SINT32:
    case TIFF_SETGET_C32_FLOAT:
      fip_local._4_4_ = 4;
      break;
    case TIFF_SETGET_UINT64:
    case TIFF_SETGET_SINT64:
    case TIFF_SETGET_DOUBLE:
    case TIFF_SETGET_IFD8:
    case TIFF_SETGET_C0_UINT64:
    case TIFF_SETGET_C0_SINT64:
    case TIFF_SETGET_C0_DOUBLE:
    case TIFF_SETGET_C0_IFD8:
    case TIFF_SETGET_C16_UINT64:
    case TIFF_SETGET_C16_SINT64:
    case TIFF_SETGET_C16_DOUBLE:
    case TIFF_SETGET_C16_IFD8:
    case TIFF_SETGET_C32_UINT64:
    case TIFF_SETGET_C32_SINT64:
    case TIFF_SETGET_C32_DOUBLE:
    case TIFF_SETGET_C32_IFD8:
      fip_local._4_4_ = 8;
      break;
    default:
      fip_local._4_4_ = 0;
    }
  }
  return fip_local._4_4_;
}

Assistant:

int TIFFFieldSetGetSize(const TIFFField *fip)
{
    /*
     * TIFFSetField() and TIFFGetField() must provide the parameter accordingly
     * to the definition of "set_field_type" of the tag definition in
     * dir_info.c. This function returns the data size for that purpose.
     *
     * Furthermore, this data size is also used for the internal storage,
     * even for TIFF_RATIONAL values for FIELD_CUSTOM, which are stored
     * internally as 4-byte float, but some of them should be stored internally
     * as 8-byte double, depending on the "set_field_type" _FLOAT_ or _DOUBLE_.
     */
    if (fip == NULL)
        return 0;

    switch (fip->set_field_type)
    {
        case TIFF_SETGET_UNDEFINED:
        case TIFF_SETGET_ASCII:
        case TIFF_SETGET_C0_ASCII:
        case TIFF_SETGET_C16_ASCII:
        case TIFF_SETGET_C32_ASCII:
        case TIFF_SETGET_OTHER:
            return 1;
        case TIFF_SETGET_UINT8:
        case TIFF_SETGET_SINT8:
        case TIFF_SETGET_C0_UINT8:
        case TIFF_SETGET_C0_SINT8:
        case TIFF_SETGET_C16_UINT8:
        case TIFF_SETGET_C16_SINT8:
        case TIFF_SETGET_C32_UINT8:
        case TIFF_SETGET_C32_SINT8:
            return 1;
        case TIFF_SETGET_UINT16:
        case TIFF_SETGET_SINT16:
        case TIFF_SETGET_C0_UINT16:
        case TIFF_SETGET_C0_SINT16:
        case TIFF_SETGET_C16_UINT16:
        case TIFF_SETGET_C16_SINT16:
        case TIFF_SETGET_C32_UINT16:
        case TIFF_SETGET_C32_SINT16:
            return 2;
        case TIFF_SETGET_INT:
        case TIFF_SETGET_UINT32:
        case TIFF_SETGET_SINT32:
        case TIFF_SETGET_FLOAT:
        case TIFF_SETGET_UINT16_PAIR:
        case TIFF_SETGET_C0_UINT32:
        case TIFF_SETGET_C0_SINT32:
        case TIFF_SETGET_C0_FLOAT:
        case TIFF_SETGET_C16_UINT32:
        case TIFF_SETGET_C16_SINT32:
        case TIFF_SETGET_C16_FLOAT:
        case TIFF_SETGET_C32_UINT32:
        case TIFF_SETGET_C32_SINT32:
        case TIFF_SETGET_C32_FLOAT:
            return 4;
        case TIFF_SETGET_UINT64:
        case TIFF_SETGET_SINT64:
        case TIFF_SETGET_DOUBLE:
        case TIFF_SETGET_IFD8:
        case TIFF_SETGET_C0_UINT64:
        case TIFF_SETGET_C0_SINT64:
        case TIFF_SETGET_C0_DOUBLE:
        case TIFF_SETGET_C0_IFD8:
        case TIFF_SETGET_C16_UINT64:
        case TIFF_SETGET_C16_SINT64:
        case TIFF_SETGET_C16_DOUBLE:
        case TIFF_SETGET_C16_IFD8:
        case TIFF_SETGET_C32_UINT64:
        case TIFF_SETGET_C32_SINT64:
        case TIFF_SETGET_C32_DOUBLE:
        case TIFF_SETGET_C32_IFD8:
            return 8;
        default:
            return 0;
    }
}